

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3f.cpp
# Opt level: O1

Vector3f Vector3f::cubicInterpolate(Vector3f *p0,Vector3f *p1,Vector3f *p2,Vector3f *p3,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float *in_RDI;
  undefined4 in_XMM0_Db;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Vector3f VVar15;
  
  VVar15.m_elements[1] = (float)in_XMM0_Db;
  VVar15.m_elements[0] = t;
  fVar6 = t + 1.0;
  fVar7 = p1->m_elements[0];
  fVar9 = p1->m_elements[1];
  fVar1 = p2->m_elements[0];
  fVar12 = t + -1.0;
  fVar10 = (fVar1 - fVar7) * t + fVar7;
  fVar2 = p2->m_elements[1];
  fVar3 = p3->m_elements[1];
  fVar11 = (fVar2 - fVar9) * t + fVar9;
  fVar13 = p1->m_elements[2];
  fVar4 = p2->m_elements[2];
  fVar5 = p3->m_elements[2];
  fVar14 = (fVar4 - fVar13) * t + fVar13;
  fVar8 = (fVar7 - p0->m_elements[0]) * fVar6 + p0->m_elements[0];
  fVar9 = (fVar9 - p0->m_elements[1]) * fVar6 + p0->m_elements[1];
  fVar13 = (fVar13 - p0->m_elements[2]) * fVar6 + p0->m_elements[2];
  VVar15.m_elements[2] = fVar6 * 0.5;
  fVar7 = t * 0.5;
  fVar8 = (fVar10 - fVar8) * VVar15.m_elements[2] + fVar8;
  fVar9 = (fVar11 - fVar9) * VVar15.m_elements[2] + fVar9;
  fVar13 = (fVar14 - fVar13) * VVar15.m_elements[2] + fVar13;
  *in_RDI = (((((p3->m_elements[0] - fVar1) * fVar12 + fVar1) - fVar10) * fVar7 + fVar10) - fVar8) *
            t + fVar8;
  in_RDI[1] = (((((fVar3 - fVar2) * fVar12 + fVar2) - fVar11) * fVar7 + fVar11) - fVar9) * t + fVar9
  ;
  in_RDI[2] = (((((fVar5 - fVar4) * fVar12 + fVar4) - fVar14) * fVar7 + fVar14) - fVar13) * t +
              fVar13;
  return (Vector3f)VVar15.m_elements;
}

Assistant:

Vector3f Vector3f::cubicInterpolate( const Vector3f& p0, const Vector3f& p1, const Vector3f& p2, const Vector3f& p3, float t )
{
	// geometric construction:
	//            t
	//   (t+1)/2     t/2
	// t+1        t	        t-1

	// bottom level
	Vector3f p0p1 = Vector3f::lerp( p0, p1, t + 1 );
	Vector3f p1p2 = Vector3f::lerp( p1, p2, t );
	Vector3f p2p3 = Vector3f::lerp( p2, p3, t - 1 );

	// middle level
	Vector3f p0p1_p1p2 = Vector3f::lerp( p0p1, p1p2, 0.5f * ( t + 1 ) );
	Vector3f p1p2_p2p3 = Vector3f::lerp( p1p2, p2p3, 0.5f * t );

	// top level
	return Vector3f::lerp( p0p1_p1p2, p1p2_p2p3, t );
}